

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLp.cpp
# Opt level: O0

void __thiscall HighsLp::userCostScale(HighsLp *this,HighsInt user_cost_scale)

{
  reference pvVar1;
  int in_ESI;
  int *in_RDI;
  __type_conflict _Var2;
  HighsInt iCol;
  double dl_user_cost_scale_value;
  HighsInt dl_user_cost_scale;
  int local_1c;
  
  if (in_ESI != in_RDI[0x81]) {
    _Var2 = std::pow<int,int>(0,0x4f2b6c);
    for (local_1c = 0; local_1c < *in_RDI; local_1c = local_1c + 1) {
      pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 2),(long)local_1c);
      *pvVar1 = _Var2 * *pvVar1;
    }
    in_RDI[0x81] = in_ESI;
  }
  return;
}

Assistant:

void HighsLp::userCostScale(const HighsInt user_cost_scale) {
  const HighsInt dl_user_cost_scale = user_cost_scale - this->user_cost_scale_;
  if (!dl_user_cost_scale) return;
  double dl_user_cost_scale_value = std::pow(2, dl_user_cost_scale);
  for (HighsInt iCol = 0; iCol < this->num_col_; iCol++)
    this->col_cost_[iCol] *= dl_user_cost_scale_value;
  this->user_cost_scale_ = user_cost_scale;
}